

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::BignumDtoa
               (double v,BignumDtoaMode mode,int requested_digits,Vector<char> buffer,int *length,
               int *decimal_point)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int in_ESI;
  uint in_EDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  undefined1 uVar5;
  double in_XMM0_Qa;
  int estimated_power;
  int normalized_exponent;
  bool is_even;
  bool need_boundary_deltas;
  float f;
  bool lower_boundary_is_closer;
  int exponent;
  uint64_t significand;
  Bignum delta_plus;
  Bignum delta_minus;
  Bignum denominator;
  Bignum numerator;
  double in_stack_fffffffffffff6e8;
  float f_00;
  Double *in_stack_fffffffffffff6f0;
  Bignum *this;
  Double *in_stack_fffffffffffff6f8;
  Bignum *this_00;
  undefined4 in_stack_fffffffffffff700;
  int in_stack_fffffffffffff704;
  int __c;
  Bignum *delta_plus_00;
  Bignum *delta_minus_00;
  Bignum *this_01;
  Bignum *this_02;
  Bignum *pBVar6;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined2 in_stack_fffffffffffff740;
  float in_stack_fffffffffffff744;
  int local_8b4;
  ulong local_8b0;
  Vector<char> local_830;
  Bignum local_820;
  Bignum local_61c;
  Bignum local_418;
  Bignum local_214;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI == 1) {
    in_stack_fffffffffffff744 = (float)in_XMM0_Qa;
    Single::Single((Single *)in_stack_fffffffffffff6f0,
                   (float)((ulong)in_stack_fffffffffffff6e8 >> 0x20));
    f_00 = (float)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
    uVar1 = Single::Significand((Single *)in_stack_fffffffffffff6f8);
    local_8b0 = (ulong)uVar1;
    Single::Single((Single *)in_stack_fffffffffffff6f0,f_00);
    local_8b4 = Single::Exponent((Single *)in_stack_fffffffffffff6f8);
    Single::Single((Single *)in_stack_fffffffffffff6f0,f_00);
    Single::LowerBoundaryIsCloser((Single *)in_stack_fffffffffffff6f0);
  }
  else {
    Double::Double(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    local_8b0 = Double::Significand(in_stack_fffffffffffff6f8);
    Double::Double(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    local_8b4 = Double::Exponent(in_stack_fffffffffffff6f8);
    Double::Double(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    Double::LowerBoundaryIsCloser(in_stack_fffffffffffff6f0);
  }
  uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffff734);
  if (in_EDI != 0) {
    uVar7 = CONCAT13(in_EDI == 1,(int3)in_stack_fffffffffffff734);
  }
  uVar8 = (undefined1)((uint)uVar7 >> 0x18);
  uVar5 = (local_8b0 & 1) == 0;
  iVar2 = NormalizedExponent(local_8b0,local_8b4);
  iVar3 = EstimatePower(in_stack_fffffffffffff704);
  if ((in_EDI == 2) && (in_ESI < -1 - iVar3)) {
    pcVar4 = Vector<char>::operator[](&local_830,0);
    *pcVar4 = '\0';
    *in_R8 = 0;
    *in_R9 = -in_ESI;
  }
  else {
    this_01 = &local_214;
    __c = 0xaa;
    delta_plus_00 = (Bignum *)0x204;
    memset(this_01,0xaa,0x204);
    Bignum::Bignum(this_01);
    this_02 = &local_418;
    memset(this_02,__c,(size_t)delta_plus_00);
    Bignum::Bignum(this_02);
    this = &local_61c;
    memset(this,__c,(size_t)delta_plus_00);
    Bignum::Bignum(this);
    this_00 = &local_820;
    delta_minus_00 = this_00;
    memset(this_00,__c,(size_t)delta_plus_00);
    Bignum::Bignum(this_00);
    pBVar6 = this;
    InitialScaledStartValues
              ((uint64_t)delta_minus_00,(int)((ulong)delta_plus_00 >> 0x20),
               SUB81((ulong)delta_plus_00 >> 0x18,0),__c,
               SUB41((uint)in_stack_fffffffffffff700 >> 0x18,0),this_00,this_02,this,
               (Bignum *)CONCAT44(uVar7,in_stack_fffffffffffff730));
    FixupMultiply10((int)((ulong)delta_minus_00 >> 0x20),SUB81((ulong)delta_minus_00 >> 0x18,0),
                    (int *)delta_plus_00,(Bignum *)CONCAT44(__c,in_stack_fffffffffffff700),this_00,
                    this,this_02);
    if (in_EDI < 2) {
      buffer_02.start_._4_4_ = uVar7;
      buffer_02.start_._0_4_ = in_EDI;
      buffer_02.length_ = iVar3;
      buffer_02._12_4_ = iVar2;
      GenerateShortestDigits
                (this_02,this_01,delta_minus_00,delta_plus_00,SUB41((uint)__c >> 0x18,0),buffer_02,
                 (int *)this_00);
    }
    else {
      iVar2 = (int)((ulong)delta_plus_00 >> 0x20);
      if (in_EDI == 2) {
        buffer_01._8_8_ = pBVar6;
        buffer_01.start_ = (char *)this_02;
        BignumToFixed(iVar2,(int *)CONCAT44(__c,in_stack_fffffffffffff700),this_00,this,buffer_01,
                      (int *)CONCAT44(in_stack_fffffffffffff744,
                                      CONCAT13(uVar8,CONCAT12(uVar5,in_stack_fffffffffffff740))));
      }
      else {
        if (in_EDI != 3) {
          abort();
        }
        buffer_00._8_8_ = this_01;
        buffer_00.start_ = (char *)delta_minus_00;
        GenerateCountedDigits
                  (iVar2,(int *)CONCAT44(__c,in_stack_fffffffffffff700),this_00,this,buffer_00,
                   (int *)CONCAT44(uVar7,3));
      }
    }
    pcVar4 = Vector<char>::operator[](&local_830,*in_R8);
    *pcVar4 = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}